

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dino_intmap.c
# Opt level: O1

_Bool intmap_exists(dino_intmap_t *map,char *key)

{
  ulong uVar1;
  dino_intmap_pair_t *pdVar2;
  char cVar3;
  char *pcVar4;
  
  if (key != (char *)0x0 && map != (dino_intmap_t *)0x0) {
    cVar3 = *key;
    if (cVar3 == '\0') {
      uVar1 = 0x1505;
    }
    else {
      pcVar4 = key + 1;
      uVar1 = 0x1505;
      do {
        uVar1 = (long)cVar3 + uVar1 * 0x21;
        cVar3 = *pcVar4;
        pcVar4 = pcVar4 + 1;
      } while (cVar3 != '\0');
    }
    pdVar2 = intmap_get_pair(map->buckets + uVar1 % (ulong)map->count,key);
    return pdVar2 != (dino_intmap_pair_t *)0x0;
  }
  return false;
}

Assistant:

bool intmap_exists(const dino_intmap_t *map, const char *key) {
    if (NULL == map || NULL == key) {
        return false;
    }

    unsigned int index = (unsigned int) (intmap_hash(key) % map->count);
    dino_intmap_bucket_t *bucket = &(map->buckets[index]);
    dino_intmap_pair_t *pair = intmap_get_pair(bucket, key);

    if (NULL == pair) {
        return false;
    }

    return true;
}